

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1FreePage(PgHdr1 *p)

{
  PCache1 *pPVar1;
  PGroup *pPVar2;
  PCache1 *pCache;
  PgHdr1 *p_local;
  
  if (p != (PgHdr1 *)0x0) {
    pPVar1 = p->pCache;
    pcache1Free((p->page).pBuf);
    if (pPVar1->bPurgeable != 0) {
      pPVar2 = pPVar1->pGroup;
      pPVar2->nCurrentPage = pPVar2->nCurrentPage - 1;
    }
  }
  return;
}

Assistant:

static void pcache1FreePage(PgHdr1 *p){
  if( ALWAYS(p) ){
    PCache1 *pCache = p->pCache;
    assert( sqlite3_mutex_held(p->pCache->pGroup->mutex) );
    pcache1Free(p->page.pBuf);
#ifdef SQLITE_PCACHE_SEPARATE_HEADER
    sqlite3_free(p);
#endif
    if( pCache->bPurgeable ){
      pCache->pGroup->nCurrentPage--;
    }
  }
}